

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall httplib::detail::scope_exit::~scope_exit(scope_exit *this)

{
  _Manager_type p_Var1;
  
  if (this->execute_on_destruction == true) {
    if ((this->exit_function).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->exit_function)._M_invoker)((_Any_data *)this);
  }
  p_Var1 = (this->exit_function).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

~scope_exit() {
    if (execute_on_destruction) { this->exit_function(); }
  }